

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_public.c
# Opt level: O1

void nhr_request_add_parameter(nhr_request request,char *name,char *value)

{
  size_t len;
  size_t len_00;
  _nhr_map_node *p_Var1;
  char *pcVar2;
  
  if (request != (nhr_request)0x0) {
    if (name == (char *)0x0) {
      len = 0;
    }
    else {
      len = strlen(name);
    }
    if (value == (char *)0x0) {
      len_00 = 0;
    }
    else {
      len_00 = strlen(value);
    }
    if (len_00 != 0 && len != 0) {
      if (request->method == 0) {
        __assert_fail("request->method",
                      "/workspace/llm4binary/github/license_c_cmakelists/OlehKulykov[P]libnhr/src/nhr_request_public.c"
                      ,0x97,
                      "void nhr_request_add_parameter(nhr_request, const char *, const char *)");
      }
      if (request->parameters == (_nhr_map_node *)0x0) {
        p_Var1 = nhr_map_create();
        request->parameters = p_Var1;
      }
      p_Var1 = nhr_map_append(request->parameters);
      pcVar2 = nhr_string_copy_len(name,len);
      p_Var1->key = pcVar2;
      pcVar2 = nhr_string_copy_len(value,len_00);
      (p_Var1->value).string = pcVar2;
      p_Var1->value_size = len_00;
      p_Var1->value_type = '\x02';
    }
  }
  return;
}

Assistant:

void nhr_request_add_parameter(nhr_request request, const char * name, const char * value) {
	size_t name_len = 0, value_len = 0;
	_nhr_map_node * last = NULL;
	if (!request) {
		return;
	}

	name_len = name ? strlen(name) : 0;
	value_len = value ? strlen(value) : 0;
	if (name_len == 0 || value_len == 0) {
		return;
	}

	assert(request->method); //!!! set method

	if (!request->parameters) {
		request->parameters = nhr_map_create();
	}
	
	last = nhr_map_append(request->parameters);
	last->key = nhr_string_copy_len(name, name_len);
	last->value.string = nhr_string_copy_len(value, value_len);
    last->value_size = value_len;
	last->value_type = NHR_MAP_VALUE_STRING;
}